

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O0

Cut_Cut_t * Cut_CutAlloc(Cut_Man_t *p)

{
  Cut_Cut_t *__s;
  Cut_Cut_t *pCut;
  Cut_Man_t *p_local;
  
  __s = (Cut_Cut_t *)Extra_MmFixedEntryFetch(p->pMmCuts);
  memset(__s,0,0x18);
  *(uint *)__s = *(uint *)__s & 0xf0ffffff | (p->pParams->nVarsMax & 0xfU) << 0x18;
  *(uint *)__s = *(uint *)__s & 0xffbfffff | (p->fSimul & 1U) << 0x16;
  p->nCutsAlloc = p->nCutsAlloc + 1;
  p->nCutsCur = p->nCutsCur + 1;
  if (p->nCutsPeak < p->nCutsAlloc - p->nCutsDealloc) {
    p->nCutsPeak = p->nCutsAlloc - p->nCutsDealloc;
  }
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cut_Cut_t * Cut_CutAlloc( Cut_Man_t * p )
{
    Cut_Cut_t * pCut;
    // cut allocation
    pCut = (Cut_Cut_t *)Extra_MmFixedEntryFetch( p->pMmCuts );
    memset( pCut, 0, sizeof(Cut_Cut_t) );
    pCut->nVarsMax   = p->pParams->nVarsMax;
    pCut->fSimul     = p->fSimul;
    // statistics
    p->nCutsAlloc++;
    p->nCutsCur++;
    if ( p->nCutsPeak < p->nCutsAlloc - p->nCutsDealloc )
        p->nCutsPeak = p->nCutsAlloc - p->nCutsDealloc;
    return pCut;
}